

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void info_tailcall(lua_Debug *ar)

{
  lua_Debug *ar_local;
  
  ar->namewhat = "";
  ar->name = "";
  ar->what = "tail";
  ar->currentline = -1;
  ar->linedefined = -1;
  ar->lastlinedefined = -1;
  ar->source = "=(tail call)";
  luaO_chunkid(ar->short_src,ar->source,0x3c);
  ar->nups = 0;
  return;
}

Assistant:

static void info_tailcall(lua_Debug*ar){
ar->name=ar->namewhat="";
ar->what="tail";
ar->lastlinedefined=ar->linedefined=ar->currentline=-1;
ar->source="=(tail call)";
luaO_chunkid(ar->short_src,ar->source,60);
ar->nups=0;
}